

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O3

void __thiscall Fl_Widget::draw_focus(Fl_Widget *this,Fl_Boxtype B,int X,int Y,int W,int H)

{
  bool bVar1;
  Fl_Color FVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  bVar1 = Fl::option(OPTION_VISIBLE_FOCUS);
  if (bVar1) {
    if ((B < FL_ENGRAVED_BOX) && ((0x2a8U >> (B & _FL_PLASTIC_DOWN_BOX) & 1) != 0)) {
      X = X + 1;
      Y = Y + 1;
    }
    FVar2 = fl_contrast(0x38,this->color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar2);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[5])(fl_graphics_driver,2,0,0);
    iVar3 = Fl::box_dx(B);
    iVar4 = Fl::box_dy(B);
    uVar5 = Fl::box_dw(B);
    uVar6 = Fl::box_dh(B);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[3])
              (fl_graphics_driver,(ulong)(uint)(X + iVar3),(ulong)(uint)(Y + iVar4),
               (ulong)(W + ~uVar5),(ulong)(H + ~uVar6));
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[5])(fl_graphics_driver,0,0,0);
    return;
  }
  return;
}

Assistant:

void
Fl_Widget::draw_focus(Fl_Boxtype B, int X, int Y, int W, int H) const {
  if (!Fl::visible_focus()) return;
  switch (B) {
    case FL_DOWN_BOX:
    case FL_DOWN_FRAME:
    case FL_THIN_DOWN_BOX:
    case FL_THIN_DOWN_FRAME:
      X ++;
      Y ++;
    default:
      break;
  }

  fl_color(fl_contrast(FL_BLACK, color()));

#if defined(USE_X11) || defined(__APPLE_QUARTZ__)
  fl_line_style(FL_DOT);
  fl_rect(X + Fl::box_dx(B), Y + Fl::box_dy(B),
          W - Fl::box_dw(B) - 1, H - Fl::box_dh(B) - 1);
  fl_line_style(FL_SOLID);
#elif defined(WIN32) 
  // Windows 95/98/ME do not implement the dotted line style, so draw
  // every other pixel around the focus area...
  //
  // Also, QuickDraw (MacOS) does not support line styles specifically,
  // and the hack we use in fl_line_style() will not draw horizontal lines
  // on odd-numbered rows...
  int i, xx, yy;

  X += Fl::box_dx(B);
  Y += Fl::box_dy(B);
  W -= Fl::box_dw(B) + 2;
  H -= Fl::box_dh(B) + 2;

  for (xx = 0, i = 1; xx < W; xx ++, i ++) if (i & 1) fl_point(X + xx, Y);
  for (yy = 0; yy < H; yy ++, i ++) if (i & 1) fl_point(X + W, Y + yy);
  for (xx = W; xx > 0; xx --, i ++) if (i & 1) fl_point(X + xx, Y + H);
  for (yy = H; yy > 0; yy --, i ++) if (i & 1) fl_point(X, Y + yy);
#else
# error unsupported platform
#endif // WIN32
}